

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_tv_ct(jit_State *J,CType *s,CTypeID sid,TRef sp)

{
  uint uVar1;
  ushort uVar2;
  IRRef1 IVar3;
  IRType IVar4;
  TRef TVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  CTState *cts_00;
  TRef in_ECX;
  CType *in_RSI;
  jit_State *in_RDI;
  TRef dp;
  TRef tr2;
  TRef tr1;
  TRef ptr;
  ptrdiff_t esz;
  TRef tr;
  CTInfo sinfo;
  IRType t;
  CTState *cts;
  undefined4 in_stack_fffffffffffffe88;
  TraceError in_stack_fffffffffffffe8c;
  jit_State *in_stack_fffffffffffffe90;
  jit_State *in_stack_fffffffffffffe98;
  jit_State *J_00;
  jit_State *in_stack_fffffffffffffea0;
  jit_State *pjVar9;
  TRef local_f0;
  
  cts_00 = (CTState *)(ulong)in_RDI[-1].bpropcache[0xc].mode;
  IVar4 = crec_ct2irt(cts_00,in_RSI);
  uVar1 = in_RSI->info;
  IVar3 = (IRRef1)in_ECX;
  uVar2 = (ushort)IVar4;
  if (uVar1 >> 0x1c == 0) {
    if (IVar4 == IRT_CDATA) {
LAB_001b6fed:
      lj_trace_err(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    }
    (in_RDI->fold).ins.field_0.ot = uVar2 | 0x4500;
    (in_RDI->fold).ins.field_0.op1 = IVar3;
    (in_RDI->fold).ins.field_0.op2 = 0;
    local_f0 = lj_opt_fold(in_stack_fffffffffffffe98);
    if ((IVar4 == IRT_FLOAT) || (IVar4 == IRT_U32)) {
      (in_RDI->fold).ins.field_0.ot = 0x590e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_f0;
      (in_RDI->fold).ins.field_0.op2 = uVar2 | 0x1c0;
      TVar5 = lj_opt_fold(in_stack_fffffffffffffe98);
      return TVar5;
    }
    if ((IVar4 != IRT_I64) && (IVar4 != IRT_U64)) {
      if ((uVar1 & 0x8000000) == 0) {
        return local_f0;
      }
      TVar5 = lj_ir_kint(in_stack_fffffffffffffea0,
                         (int32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      (in_RDI->fold).ins.field_0.ot = 0x993;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_f0;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
      in_RDI->postproc = LJ_POST_FIXGUARD;
      return 0x2007ffd;
    }
  }
  else if ((uVar1 >> 0x1c == 2) || (uVar1 >> 0x1c == 5)) {
    (in_RDI->fold).ins.field_0.ot = uVar2 | 0x4500;
    (in_RDI->fold).ins.field_0.op1 = IVar3;
    (in_RDI->fold).ins.field_0.op2 = 0;
    local_f0 = lj_opt_fold(in_stack_fffffffffffffe98);
  }
  else {
    if (((uVar1 & 0xfc000000) != 0x30000000) && (uVar1 >> 0x1c != 1)) {
      if ((uVar1 & 0xf4000000) == 0x34000000) {
        J_00 = in_RDI;
        TVar5 = lj_ir_kint(in_stack_fffffffffffffea0,(int32_t)((ulong)in_RDI >> 0x20));
        (J_00->fold).ins.field_0.ot = 0x518a;
        (J_00->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (J_00->fold).ins.field_0.op2 = 0x7fff;
        TVar5 = lj_opt_fold(J_00);
        (in_RDI->fold).ins.field_0.ot = uVar2 | 0x4500;
        (in_RDI->fold).ins.field_0.op1 = IVar3;
        (in_RDI->fold).ins.field_0.op2 = 0;
        TVar6 = lj_opt_fold(J_00);
        pjVar9 = in_RDI;
        TVar7 = lj_ir_kint64(in_stack_fffffffffffffe90,
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        (pjVar9->fold).ins.field_0.ot = 0x2909;
        (pjVar9->fold).ins.field_0.op1 = IVar3;
        (pjVar9->fold).ins.field_0.op2 = (IRRef1)TVar7;
        TVar7 = lj_opt_fold(J_00);
        (in_RDI->fold).ins.field_0.ot = uVar2 | 0x4500;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar7;
        (in_RDI->fold).ins.field_0.op2 = 0;
        TVar7 = lj_opt_fold(J_00);
        TVar8 = lj_ir_kint64(in_stack_fffffffffffffe90,
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        (in_RDI->fold).ins.field_0.ot = 0x2909;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar8;
        TVar8 = lj_opt_fold(J_00);
        (in_RDI->fold).ins.field_0.ot = uVar2 | 0x4c00;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar6;
        lj_opt_fold(J_00);
        TVar6 = lj_ir_kint64(in_stack_fffffffffffffe90,
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        (in_RDI->fold).ins.field_0.ot = 0x2909;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar6 = lj_opt_fold(J_00);
        (in_RDI->fold).ins.field_0.ot = uVar2 | 0x4c00;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar6;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar7;
        lj_opt_fold(J_00);
        return TVar5;
      }
      goto LAB_001b6fed;
    }
    cts_00->L = in_RDI->L;
    lj_ctype_intern((CTState *)in_stack_fffffffffffffe98,
                    (CTInfo)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                    (CTSize)in_stack_fffffffffffffe90);
    local_f0 = in_ECX;
  }
  TVar5 = lj_ir_kint(in_stack_fffffffffffffea0,(int32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  (in_RDI->fold).ins.field_0.ot = 0x528a;
  (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_f0;
  TVar5 = lj_opt_fold(in_stack_fffffffffffffe98);
  return TVar5;
}

Assistant:

static TRef crec_tv_ct(jit_State *J, CType *s, CTypeID sid, TRef sp)
{
  CTState *cts = ctype_ctsG(J2G(J));
  IRType t = crec_ct2irt(cts, s);
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    TRef tr;
    if (t == IRT_CDATA)
      goto err_nyi;  /* NYI: copyval of >64 bit integers. */
    tr = emitir(IRT(IR_XLOAD, t), sp, 0);
    if (t == IRT_FLOAT || t == IRT_U32) {  /* Keep uint32_t/float as numbers. */
      return emitconv(tr, IRT_NUM, t, 0);
    } else if (t == IRT_I64 || t == IRT_U64) {  /* Box 64 bit integer. */
      sp = tr;
      lj_needsplit(J);
    } else if ((sinfo & CTF_BOOL)) {
      /* Assume not equal to zero. Fixup and emit pending guard later. */
      lj_ir_set(J, IRTGI(IR_NE), tr, lj_ir_kint(J, 0));
      J->postproc = LJ_POST_FIXGUARD;
      return TREF_TRUE;
    } else {
      return tr;
    }
  } else if (ctype_isptr(sinfo) || ctype_isenum(sinfo)) {
    sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Box pointers and enums. */
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    cts->L = J->L;
    sid = lj_ctype_intern(cts, CTINFO_REF(sid), CTSIZE_PTR);  /* Create ref. */
  } else if (ctype_iscomplex(sinfo)) {  /* Unbox/box complex. */
    ptrdiff_t esz = (ptrdiff_t)(s->size >> 1);
    TRef ptr, tr1, tr2, dp;
    dp = emitir(IRTG(IR_CNEW, IRT_CDATA), lj_ir_kint(J, sid), TREF_NIL);
    tr1 = emitir(IRT(IR_XLOAD, t), sp, 0);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, esz));
    tr2 = emitir(IRT(IR_XLOAD, t), ptr, 0);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), dp, lj_ir_kintp(J, sizeof(GCcdata)));
    emitir(IRT(IR_XSTORE, t), ptr, tr1);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), dp, lj_ir_kintp(J, sizeof(GCcdata)+esz));
    emitir(IRT(IR_XSTORE, t), ptr, tr2);
    return dp;
  } else {
    /* NYI: copyval of vectors. */
  err_nyi:
    lj_trace_err(J, LJ_TRERR_NYICONV);
  }
  /* Box pointer, ref, enum or 64 bit integer. */
  return emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, sid), sp);
}